

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall
FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor>::FileInfoWrapper
          (FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> *this,
          IFileReaderFactory *fileReaderFactory)

{
  IFileReaderFactory *fileReaderFactory_local;
  FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> *this_local;
  
  this->_vptr_FileInfoWrapper = (_func_int **)&PTR__FileInfoWrapper_0012bc28;
  AS_02::JXS::MXFReader::MXFReader(&this->m_Reader,fileReaderFactory);
  MyJXSDescriptor::MyJXSDescriptor(&this->m_Desc);
  ASDCP::WriterInfo::WriterInfo(&this->m_WriterInfo);
  this->m_MaxBitrate = 0.0;
  this->m_AvgBitrate = 0.0;
  ASDCP::UL::UL(&this->m_PictureEssenceCoding);
  return;
}

Assistant:

FileInfoWrapper(const IFileReaderFactory& fileReaderFactory) : m_MaxBitrate(0.0), m_AvgBitrate(0.0), m_Reader(fileReaderFactory) {}